

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void xLearn::WriteFile(void)

{
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR.txt");
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm.txt");
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv.txt");
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_comma.txt");
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_comma.txt");
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv_comma.txt");
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no.txt");
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no.txt");
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no_comma.txt");
  std::operator+(&bStack_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no_comma.txt");
  write_data(&local_28,(string *)kStr_abi_cxx11_);
  write_data(&local_48,(string *)kStrFFM_abi_cxx11_);
  write_data(&local_68,(string *)kStrCSV_abi_cxx11_);
  write_data(&local_e8,(string *)kStrNoy_abi_cxx11_);
  write_data(&local_108,(string *)kStrFFMNoy_abi_cxx11_);
  write_data(&local_88,(string *)kStr_abi_cxx11_);
  write_data(&local_a8,(string *)kStrFFM_abi_cxx11_);
  write_data(&local_c8,(string *)kStrCSV_abi_cxx11_);
  write_data(&local_128,(string *)kStrNoy_abi_cxx11_);
  write_data(&bStack_148,(string *)kStrFFMNoy_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void WriteFile() {
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // Create file
  write_data(lr_file, kStr);
  write_data(ffm_file, kStrFFM);
  write_data(csv_file, kStrCSV);
  write_data(lr_no_file, kStrNoy);
  write_data(ffm_no_file, kStrFFMNoy);
  write_data(lr_file_comma, kStr);
  write_data(ffm_file_comma, kStrFFM);
  write_data(csv_file_comma, kStrCSV);
  write_data(lr_no_file_comma, kStrNoy);
  write_data(ffm_no_file_comma, kStrFFMNoy);
}